

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextRemoveNode
               (ImGuiContext *ctx,ImGuiDockNode *node,bool merge_sibling_into_parent_node)

{
  int *piVar1;
  ImGuiID key;
  bool bVar2;
  ImGuiDockNode *pIVar3;
  long lVar4;
  ImGuiDockNode *merge_lead_child;
  bool bVar5;
  
  key = node->ID;
  pIVar3 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,key);
  if (pIVar3 != node) {
    __assert_fail("DockContextFindNodeByID(ctx, node->ID) == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2eb0,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) || (node->ChildNodes[1] != (ImGuiDockNode *)0x0)
     ) {
    __assert_fail("node->ChildNodes[0] == __null && node->ChildNodes[1] == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2eb1,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if ((node->Windows).Size != 0) {
    __assert_fail("node->Windows.Size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2eb2,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if (node->HostWindow != (ImGuiWindow *)0x0) {
    node->HostWindow->DockNodeAsHost = (ImGuiDockNode *)0x0;
  }
  pIVar3 = node->ParentNode;
  if (!merge_sibling_into_parent_node || pIVar3 == (ImGuiDockNode *)0x0) {
    if (pIVar3 != (ImGuiDockNode *)0x0) {
      lVar4 = 0;
      bVar5 = true;
      do {
        bVar2 = bVar5;
        if (pIVar3->ChildNodes[lVar4] == node) {
          node->ParentNode->ChildNodes[lVar4] = (ImGuiDockNode *)0x0;
        }
        lVar4 = 1;
        bVar5 = false;
      } while (bVar2);
    }
    ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,key,(void *)0x0);
    ImGuiDockNode::~ImGuiDockNode(node);
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(node,GImAllocatorUserData);
    return;
  }
  merge_lead_child = pIVar3->ChildNodes[1];
  if ((pIVar3->ChildNodes[0] != node) &&
     (bVar5 = merge_lead_child != node, merge_lead_child = pIVar3->ChildNodes[0], bVar5)) {
    __assert_fail("parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x2ebb,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  DockNodeTreeMerge(ctx,pIVar3,merge_lead_child);
  return;
}

Assistant:

static void ImGui::DockContextRemoveNode(ImGuiContext* ctx, ImGuiDockNode* node, bool merge_sibling_into_parent_node)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;

    IMGUI_DEBUG_LOG_DOCKING("DockContextRemoveNode 0x%08X\n", node->ID);
    IM_ASSERT(DockContextFindNodeByID(ctx, node->ID) == node);
    IM_ASSERT(node->ChildNodes[0] == NULL && node->ChildNodes[1] == NULL);
    IM_ASSERT(node->Windows.Size == 0);

    if (node->HostWindow)
        node->HostWindow->DockNodeAsHost = NULL;

    ImGuiDockNode* parent_node = node->ParentNode;
    const bool merge = (merge_sibling_into_parent_node && parent_node != NULL);
    if (merge)
    {
        IM_ASSERT(parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node);
        ImGuiDockNode* sibling_node = (parent_node->ChildNodes[0] == node ? parent_node->ChildNodes[1] : parent_node->ChildNodes[0]);
        DockNodeTreeMerge(&g, parent_node, sibling_node);
    }
    else
    {
        for (int n = 0; parent_node && n < IM_ARRAYSIZE(parent_node->ChildNodes); n++)
            if (parent_node->ChildNodes[n] == node)
                node->ParentNode->ChildNodes[n] = NULL;
        dc->Nodes.SetVoidPtr(node->ID, NULL);
        IM_DELETE(node);
    }
}